

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

tm * __thiscall spdlog::details::os::gmtime(os *this,time_t *__timer)

{
  time_t *time_tt_local;
  
  gmtime_r(__timer,(tm *)this);
  return (tm *)this;
}

Assistant:

inline std::tm gmtime(const std::time_t &time_tt)
{

#ifdef _WIN32
    std::tm tm;
    gmtime_s(&tm, &time_tt);
#else
    std::tm tm;
    gmtime_r(&time_tt, &tm);
#endif
    return tm;
}